

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safe_list.h
# Opt level: O2

void __thiscall
obs::safe_list<obs::slot<void_(int)>_>::push_back
          (safe_list<obs::slot<void_(int)>_> *this,slot<void_(int)> *value)

{
  node *this_00;
  node **ppnVar1;
  bool bVar2;
  
  this_00 = (node *)operator_new(0x28);
  node::node(this_00,value);
  std::mutex::lock(&this->m_mutex_nodes);
  bVar2 = this->m_first != (node *)0x0;
  ppnVar1 = &this->m_last->next;
  if (!bVar2) {
    ppnVar1 = &this->m_last;
  }
  *ppnVar1 = this_00;
  (&this->m_first)[bVar2] = this_00;
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void push_back(T* value) {
    node* n = new node(value);

    std::lock_guard<std::mutex> lock(m_mutex_nodes);
    if (!m_first)
      m_first = m_last = n;
    else {
      m_last->next = n;
      m_last = n;
    }
  }